

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O0

bool __thiscall cmInstalledFile::GetProperty(cmInstalledFile *this,string *prop,string *value)

{
  bool bVar1;
  pointer ppVar2;
  reference this_00;
  pointer this_01;
  string *psVar3;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> *ve
  ;
  const_iterator __end1;
  const_iterator __begin1;
  ExpressionVectorType *__range1;
  string separator;
  string output;
  Property *property;
  _Self local_30;
  const_iterator i;
  string *value_local;
  string *prop_local;
  cmInstalledFile *this_local;
  
  i._M_node = (_Base_ptr)value;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
       ::find(&this->Properties,prop);
  property = (Property *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
             ::end(&this->Properties);
  bVar1 = std::operator==(&local_30,(_Self *)&property);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>
             ::operator->(&local_30);
    std::__cxx11::string::string((string *)(separator.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&__range1);
    __end1 = std::
             vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ::begin(&(ppVar2->second).ValueExpressions);
    ve = (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *)std::
            vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
            ::end(&(ppVar2->second).ValueExpressions);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                                  *)&ve);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                ::operator*(&__end1);
      std::__cxx11::string::operator+=
                ((string *)(separator.field_2._M_local_buf + 8),(string *)&__range1);
      this_01 = std::
                unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                ::operator->(this_00);
      psVar3 = cmCompiledGeneratorExpression::GetInput_abi_cxx11_(this_01);
      std::__cxx11::string::operator+=
                ((string *)(separator.field_2._M_local_buf + 8),(string *)psVar3);
      std::__cxx11::string::operator=((string *)&__range1,";");
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::string::operator=
              ((string *)i._M_node,(string *)(separator.field_2._M_local_buf + 8));
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)&__range1);
    std::__cxx11::string::~string((string *)(separator.field_2._M_local_buf + 8));
  }
  return this_local._7_1_;
}

Assistant:

bool cmInstalledFile::GetProperty(const std::string& prop,
                                  std::string& value) const
{
  auto i = this->Properties.find(prop);
  if (i == this->Properties.end()) {
    return false;
  }

  Property const& property = i->second;

  std::string output;
  std::string separator;

  for (const auto& ve : property.ValueExpressions) {
    output += separator;
    output += ve->GetInput();
    separator = ";";
  }

  value = output;
  return true;
}